

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictSet::conflictAnalysis
          (ConflictSet *this,HighsInt *proofinds,double *proofvals,HighsInt prooflen,double proofrhs
          ,HighsConflictPool *conflictPool)

{
  bool bVar1;
  int iVar2;
  reference pLVar3;
  size_type sVar4;
  pointer pHVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  undefined4 in_ECX;
  double in_RDX;
  HighsPseudocost *in_RSI;
  HighsConflictPool *in_RDI;
  HighsInt *unaff_retaddr;
  ConflictSet *in_stack_00000008;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_00000030;
  HighsDomain *in_stack_00000038;
  HighsConflictPool *in_stack_00000040;
  HighsInt numNewConflicts;
  HighsInt branchpos;
  HighsInt currDepth;
  HighsInt lastDepth;
  HighsInt numConflicts;
  LocalDomChg *locdomchg;
  iterator __end1;
  iterator __begin1;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *__range1;
  HighsCDouble activitymin;
  HighsInt ninfmin;
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *this_00;
  set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  *in_stack_ffffffffffffff20;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  in_stack_ffffffffffffff28;
  double dVar10;
  HighsPseudocost *in_stack_ffffffffffffff30;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  __first;
  size_type in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  HighsInt in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int local_80;
  int local_7c;
  HighsInt *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  HighsInt *in_stack_ffffffffffffffa0;
  __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
  in_stack_ffffffffffffffa8;
  HighsDomain *in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffc0;
  int local_34;
  undefined4 in_stack_ffffffffffffffe0;
  HighsPseudocost *pHVar11;
  HighsConflictPool *vals;
  
  vals = in_RDI;
  std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
            ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
             (*(long *)in_RDI + 0x48));
  std::
  vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  ::reserve((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
            in_stack_ffffffffffffff48);
  this_00 = (vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
             *)&stack0xffffffffffffffb8;
  computeMinActivity(in_stack_ffffffffffffffb0,
                     (HighsInt)((ulong)in_stack_ffffffffffffffa8._M_current >> 0x20),
                     (HighsInt)in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                     (HighsCDouble *)in_stack_ffffffffffffffc0);
  if (local_34 == 0) {
    pHVar11 = in_RSI;
    HighsCDouble::operator_cast_to_double((HighsCDouble *)&stack0xffffffffffffffb8);
    bVar1 = explainInfeasibilityLeq
                      (in_stack_00000008,unaff_retaddr,(double *)vals,
                       (HighsInt)((ulong)pHVar11 >> 0x20),in_RDX,
                       (double)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    if (bVar1) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ca25c);
      HighsPseudocost::increaseConflictWeight(in_RSI);
      std::
      vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ::begin(this_00);
      std::
      vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ::end(this_00);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                 *)in_stack_ffffffffffffff20,
                                (__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                                 *)this_00), bVar1) {
        pLVar3 = __gnu_cxx::
                 __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                 ::operator*((__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                              *)&stack0xffffffffffffffa8);
        if ((pLVar3->domchg).boundtype == kLower) {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x5ca304);
          HighsPseudocost::increaseConflictScoreUp
                    (in_stack_ffffffffffffff30,
                     (HighsInt)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20));
        }
        else {
          std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                    ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                     0x5ca33b);
          HighsPseudocost::increaseConflictScoreDown
                    (in_stack_ffffffffffffff30,
                     (HighsInt)((ulong)in_stack_ffffffffffffff28._M_current >> 0x20));
        }
        __gnu_cxx::
        __normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
        ::operator++((__normal_iterator<HighsDomain::ConflictSet::LocalDomChg_*,_std::vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>_>
                      *)&stack0xffffffffffffffa8);
      }
      sVar4 = std::
              vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              ::size((vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                      *)&(in_RDI->freeSpaces_)._M_t._M_impl.super__Rb_tree_header);
      pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x5ca3a1);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&pHVar5->integral_cols);
      if (sVar4 * 10 <= sVar6 * 3 + 1000) {
        __first._M_current =
             (LocalDomChg *)
             &(in_RDI->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
        std::
        vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
        ::begin(this_00);
        std::
        vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
        ::end(this_00);
        std::
        set<HighsDomain::ConflictSet::LocalDomChg,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
        ::
        insert<__gnu_cxx::__normal_iterator<HighsDomain::ConflictSet::LocalDomChg*,std::vector<HighsDomain::ConflictSet::LocalDomChg,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>>>
                  (in_stack_ffffffffffffff20,__first,in_stack_ffffffffffffff28);
        pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                 operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                             *)0x5ca434);
        HighsDebugSol::checkConflictReasonFrontier
                  ((HighsDebugSol *)&pHVar5->field_0x68b0,
                   (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                    *)&(in_RDI->ageDistribution_).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,
                   (vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                   (*(long *)in_RDI + 0x48));
        local_7c = 0;
        sVar4 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(*(long *)in_RDI + 0x2c0));
        iVar2 = (int)sVar4;
        local_80 = iVar2;
        for (; -1 < iVar2; iVar2 = iVar2 + -1) {
          if (iVar2 < 1) {
LAB_005ca50d:
            in_stack_ffffffffffffff74 =
                 computeCuts((ConflictSet *)CONCAT44(iVar2,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff74,in_RDI);
            if (in_stack_ffffffffffffff74 == -1) {
              local_80 = local_80 + -1;
            }
            else {
              local_7c = in_stack_ffffffffffffff74 + local_7c;
              if ((local_7c == 0) || ((3 < local_80 - iVar2 && (in_stack_ffffffffffffff74 == 0))))
              break;
            }
          }
          else {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(*(long *)in_RDI + 0x2c0),
                                (long)(iVar2 + -1));
            in_stack_ffffffffffffff78 = *pvVar7;
            pvVar8 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                               ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                                (*(long *)in_RDI + 0x48),(long)in_stack_ffffffffffffff78);
            dVar10 = pvVar8->boundval;
            pvVar9 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                     operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                 *)(*(long *)in_RDI + 0x78),(long)in_stack_ffffffffffffff78);
            if ((dVar10 != pvVar9->first) || (NAN(dVar10) || NAN(pvVar9->first))) goto LAB_005ca50d;
            local_80 = local_80 + -1;
          }
        }
        if (iVar2 == local_80) {
          HighsConflictPool::addConflictCut(in_stack_00000040,in_stack_00000038,in_stack_00000030);
        }
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::ConflictSet::conflictAnalysis(
    const HighsInt* proofinds, const double* proofvals, HighsInt prooflen,
    double proofrhs, HighsConflictPool& conflictPool) {
  resolvedDomainChanges.reserve(localdom.domchgstack_.size());

  HighsInt ninfmin;
  HighsCDouble activitymin;
  globaldom.computeMinActivity(0, prooflen, proofinds, proofvals, ninfmin,
                               activitymin);
  if (ninfmin != 0) return;

  if (!explainInfeasibilityLeq(proofinds, proofvals, prooflen, proofrhs,
                               double(activitymin)))
    return;

  localdom.mipsolver->mipdata_->pseudocost.increaseConflictWeight();
  for (const LocalDomChg& locdomchg : resolvedDomainChanges) {
    if (locdomchg.domchg.boundtype == HighsBoundType::kLower)
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreUp(
          locdomchg.domchg.column);
    else
      localdom.mipsolver->mipdata_->pseudocost.increaseConflictScoreDown(
          locdomchg.domchg.column);
  }

  if (10 * resolvedDomainChanges.size() >
      1000 + 3 * localdom.mipsolver->mipdata_->integral_cols.size())
    return;

  reasonSideFrontier.insert(resolvedDomainChanges.begin(),
                            resolvedDomainChanges.end());

  assert(resolvedDomainChanges.size() == reasonSideFrontier.size());

  localdom.mipsolver->mipdata_->debugSolution.checkConflictReasonFrontier(
      reasonSideFrontier, localdom.domchgstack_);

  HighsInt numConflicts = 0;
  HighsInt lastDepth = localdom.branchPos_.size();
  HighsInt currDepth;
  for (currDepth = lastDepth; currDepth >= 0; --currDepth) {
    if (currDepth > 0) {
      // skip redundant branching changes which are just added for symmetry
      // handling
      HighsInt branchpos = localdom.branchPos_[currDepth - 1];
      if (localdom.domchgstack_[branchpos].boundval ==
          localdom.prevboundval_[branchpos].first) {
        --lastDepth;
        continue;
      }
    }
    HighsInt numNewConflicts = computeCuts(currDepth, conflictPool);
    // if the depth level was empty, do not consider it
    if (numNewConflicts == -1) {
      --lastDepth;
      continue;
    }

    numConflicts += numNewConflicts;
    // if no conflict was found in the first non-empty depth level we stop here
    if (numConflicts == 0) break;
    // if no conflict was found in this depth level and all conflicts of the
    // first 5 non-empty depth levels are generated we stop here
    if (lastDepth - currDepth >= 4 && numNewConflicts == 0) break;
  }

  // if we stopped in the highest non-empty depth it means no conflicts where
  // added yet. We want to at least add the current conflict frontier as it
  // means the bound change leading to infeasibility was the last branching
  // itself and hence should have been propagated in the previous depth but was
  // not, e.g. because the threshold for an integral variable was not reached.
  if (currDepth == lastDepth)
    conflictPool.addConflictCut(localdom, reasonSideFrontier);
}